

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation_Management_Header.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Simulation_Management_Header::Simulation_Management_Header
          (Simulation_Management_Header *this,Header *H,KDataStream *stream)

{
  Header7::Header7(&this->super_Header,H);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Simulation_Management_Header_003354a0;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_OriginatingEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_ReceivingEntityID);
  (*(this->super_Header).super_Header6._vptr_Header6[3])(this,stream,1);
  return;
}

Assistant:

Simulation_Management_Header::Simulation_Management_Header(const Header &H, KDataStream &stream) noexcept(false) :
    Header( H )
{
    Decode( stream, true );
}